

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReader::setDevice(QXmlStreamReader *this,QIODevice *device)

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  EVP_PKEY_CTX *ctx;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  ctx = (EVP_PKEY_CTX *)device;
  if ((this_00._M_head_impl)->deleteDevice == true) {
    if ((this_00._M_head_impl)->device != (QIODevice *)0x0) {
      (*((this_00._M_head_impl)->device->super_QObject)._vptr_QObject[4])();
    }
    (this_00._M_head_impl)->deleteDevice = false;
  }
  (this_00._M_head_impl)->device = device;
  QXmlStreamReaderPrivate::init(this_00._M_head_impl,ctx);
  return;
}

Assistant:

void QXmlStreamReader::setDevice(QIODevice *device)
{
    Q_D(QXmlStreamReader);
    if (d->deleteDevice) {
        delete d->device;
        d->deleteDevice = false;
    }
    d->device = device;
    d->init();

}